

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_date_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int64_t iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  JSValueUnion JVar8;
  JSValue *pJVar9;
  JSValue *argv_00;
  int64_t *piVar10;
  ulong uVar11;
  double dVar12;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  anon_union_8_2_94730072 u;
  JSValue this_val;
  JSValue ctor;
  JSValue JVar13;
  JSValue JVar14;
  JSValue JVar15;
  JSValue JVar16;
  JSValue val;
  JSValue val_00;
  double a;
  JSValueUnion local_98;
  undefined8 uStack_90;
  JSValueUnion local_80;
  ulong local_78;
  ulong local_70;
  double fields [7];
  
  uVar5 = new_target.tag;
  JVar13.u = new_target.u;
  iVar3 = (int)new_target.tag;
  uVar1 = 0;
  if ((uVar5 & 0xffffffff) != 3) {
    uVar1 = argc;
  }
  if (uVar1 == 1) {
    if ((int)argv->tag == -1) {
      JVar8 = (JSValueUnion)(argv->u).ptr;
      if (*(short *)((long)JVar8.ptr + 6) != 10) goto LAB_0012ae30;
      iVar2 = (int)*(int64_t *)((long)JVar8.ptr + 0x38);
      if ((iVar2 != 7) && (iVar2 != 0)) goto LAB_0012ae30;
      val.tag = *(int64_t *)((long)JVar8.ptr + 0x38);
      val.u.ptr = ((JSValueUnion *)((long)JVar8.ptr + 0x30))->ptr;
      local_80 = JVar13.u;
      iVar2 = JS_ToFloat64(ctx,&a,val);
LAB_0012ae9e:
      if (iVar2 == 0) {
        if (ABS(a) <= 8.64e+15) {
          dVar12 = trunc(a);
          local_98.float64 = dVar12 + 0.0;
        }
        else {
          local_98 = (JSValueUnion)0x7ff8000000000000;
        }
        uStack_90 = 0;
        JVar13.u = local_80;
        goto LAB_0012aefa;
      }
    }
    else {
      JVar8 = (JSValueUnion)(argv->u).ptr;
LAB_0012ae30:
      JVar14.tag = argv->tag;
      JVar14.u.ptr = JVar8.ptr;
      iVar2 = 2;
      local_80 = JVar13.u;
      JVar15 = JS_ToPrimitive(ctx,JVar14,2);
      this_val.tag = JVar15.tag;
      fields._0_16_ = (undefined1  [16])JVar15;
      if ((int)JVar15.tag != -7) {
LAB_0012ae99:
        iVar2 = JS_ToFloat64Free(ctx,&a,JVar15);
        goto LAB_0012ae9e;
      }
      this_val.u.ptr = JVar8.ptr;
      JVar13 = js_Date_parse(ctx,this_val,iVar2,(JSValue *)fields);
      local_98 = JVar13.u;
      JS_FreeValue(ctx,JVar15);
      if ((int)JVar13.tag != 6) {
        JVar15.tag = JVar13.tag;
        JVar15.u.float64 = local_98.float64;
        goto LAB_0012ae99;
      }
    }
LAB_0012aea2:
    iVar4 = 6;
    uVar5 = 0;
    uVar7 = 0;
  }
  else {
    if (uVar1 == 0) {
      iVar4 = date_now();
      local_98.float64 = (double)iVar4;
      uStack_90 = extraout_XMM0_Qb;
    }
    else {
      fields[4] = 0.0;
      fields[5] = 0.0;
      fields[0] = 0.0;
      fields[1] = 0.0;
      fields[6] = 0.0;
      uVar6 = 7;
      if ((int)uVar1 < 7) {
        uVar6 = uVar1;
      }
      fields._16_16_ = ZEXT816(0x3ff0000000000000);
      uVar11 = 0;
      local_98.int32 = uVar6;
      uVar7 = 0;
      if (0 < (int)uVar6) {
        uVar7 = (ulong)uVar6;
      }
      piVar10 = &argv->tag;
      local_80 = JVar13.u;
      local_78 = uVar5;
      local_70 = uVar5 & 0xffffffff;
      for (; uVar7 != uVar11; uVar11 = uVar11 + 1) {
        val_00.tag = *piVar10;
        val_00.u.ptr = ((JSValueUnion *)(piVar10 + -1))->ptr;
        iVar3 = JS_ToFloat64(ctx,&a,val_00);
        if (iVar3 != 0) goto LAB_0012aea2;
        if (0x7fefffffffffffff < (ulong)ABS(a)) {
          uVar7 = uVar11 & 0xffffffff;
          break;
        }
        dVar12 = trunc(a);
        fields[uVar11] = dVar12;
        if (((uVar11 == 0) && (0.0 <= fields[0])) && (fields[0] < 100.0)) {
          fields[0] = fields[0] + 1900.0;
        }
        piVar10 = piVar10 + 2;
      }
      uVar5 = local_78;
      iVar3 = (int)local_70;
      if ((int)uVar7 == local_98._0_4_) {
        local_98.float64 = set_date_fields(fields,1);
        JVar13.u = local_80;
        uStack_90 = extraout_XMM0_Qb_00;
      }
      else {
        local_98 = (JSValueUnion)0x7ff8000000000000;
        uStack_90 = 0;
        JVar13.u = local_80;
      }
    }
LAB_0012aefa:
    ctor.tag = uVar5;
    ctor.u.float64 = JVar13.u.float64;
    JVar14 = js_create_from_ctor(ctx,ctor,10);
    JVar15 = JVar14;
    if ((int)JVar14.tag != 6) {
      uVar5 = (ulong)local_98 & 0xffffffff;
      pJVar9 = (JSValue *)((ulong)local_98 & 0xffffffff00000000);
      if (local_98 == (JSValueUnion)(double)(int)(double)local_98) {
        uVar5 = (ulong)(uint)(int)(double)local_98;
        pJVar9 = (JSValue *)0x0;
      }
      argv_00 = (JSValue *)0x7;
      if (local_98 == (JSValueUnion)(double)(int)(double)local_98) {
        argv_00 = (JSValue *)0x0;
      }
      JVar13.u.ptr = (void *)(uVar5 | (ulong)pJVar9);
      JVar13.tag = (int64_t)argv_00;
      JS_SetObjectData(ctx,JVar14,JVar13);
      if (iVar3 == 3) {
        JVar15 = get_date_string(ctx,JVar14,JVar13.u.int32,argv_00,0x13);
        JS_FreeValue(ctx,JVar14);
      }
    }
    iVar4 = JVar15.tag;
    uVar7 = (ulong)JVar15.u.ptr & 0xffffffff00000000;
    uVar5 = (ulong)JVar15.u.ptr & 0xffffffff;
  }
  JVar16.u.ptr = (void *)(uVar5 | uVar7);
  JVar16.tag = iVar4;
  return JVar16;
}

Assistant:

static JSValue js_date_constructor(JSContext *ctx, JSValueConst new_target,
                                   int argc, JSValueConst *argv)
{
    // Date(y, mon, d, h, m, s, ms)
    JSValue rv;
    int i, n;
    double a, val;

    if (JS_IsUndefined(new_target)) {
        /* invoked as function */
        argc = 0;
    }
    n = argc;
    if (n == 0) {
        val = date_now();
    } else if (n == 1) {
        JSValue v, dv;
        if (JS_VALUE_GET_TAG(argv[0]) == JS_TAG_OBJECT) {
            JSObject *p = JS_VALUE_GET_OBJ(argv[0]);
            if (p->class_id == JS_CLASS_DATE && JS_IsNumber(p->u.object_data)) {
                if (JS_ToFloat64(ctx, &val, p->u.object_data))
                    return JS_EXCEPTION;
                val = time_clip(val);
                goto has_val;
            }
        }
        v = JS_ToPrimitive(ctx, argv[0], HINT_NONE);
        if (JS_IsString(v)) {
            dv = js_Date_parse(ctx, JS_UNDEFINED, 1, (JSValueConst *)&v);
            JS_FreeValue(ctx, v);
            if (JS_IsException(dv))
                return JS_EXCEPTION;
            if (JS_ToFloat64Free(ctx, &val, dv))
                return JS_EXCEPTION;
        } else {
            if (JS_ToFloat64Free(ctx, &val, v))
                return JS_EXCEPTION;
        }
        val = time_clip(val);
    } else {
        double fields[] = { 0, 0, 1, 0, 0, 0, 0 };
        if (n > 7)
            n = 7;
        for(i = 0; i < n; i++) {
            if (JS_ToFloat64(ctx, &a, argv[i]))
                return JS_EXCEPTION;
            if (!isfinite(a))
                break;
            fields[i] = trunc(a);
            if (i == 0 && fields[0] >= 0 && fields[0] < 100)
                fields[0] += 1900;
        }
        val = (i == n) ? set_date_fields(fields, 1) : NAN;
    }
has_val:
#if 0
    JSValueConst args[3];
    args[0] = new_target;
    args[1] = ctx->class_proto[JS_CLASS_DATE];
    args[2] = JS_NewFloat64(ctx, val);
    rv = js___date_create(ctx, JS_UNDEFINED, 3, args);
#else
    rv = js_create_from_ctor(ctx, new_target, JS_CLASS_DATE);
    if (!JS_IsException(rv))
        JS_SetObjectData(ctx, rv, JS_NewFloat64(ctx, val));
#endif
    if (!JS_IsException(rv) && JS_IsUndefined(new_target)) {
        /* invoked as a function, return (new Date()).toString(); */
        JSValue s;
        s = get_date_string(ctx, rv, 0, NULL, 0x13);
        JS_FreeValue(ctx, rv);
        rv = s;
    }
    return rv;
}